

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O0

REF_STATUS ref_phys_spalding_uplus(REF_DBL yplus,REF_DBL *uplus)

{
  bool bVar1;
  uint uVar2;
  double dVar3;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_58;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT iters;
  REF_BOOL keep_going;
  REF_DBL dyplus_duplus;
  REF_DBL error;
  REF_DBL y;
  REF_DBL u;
  REF_DBL *uplus_local;
  REF_DBL yplus_local;
  
  y = yplus;
  u = (REF_DBL)uplus;
  uplus_local = (REF_DBL *)yplus;
  if (12.0 < yplus) {
    dVar3 = log(yplus / 0.1108);
    y = dVar3 / 0.4;
  }
  ref_private_macro_code_rss_1 = 0;
  bVar1 = true;
  do {
    if (!bVar1) {
      *(REF_DBL *)u = y;
      return 0;
    }
    uVar2 = ref_phys_spalding_yplus(y,&error);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x295,
             "ref_phys_spalding_uplus",(ulong)uVar2,"yplus");
      return uVar2;
    }
    dyplus_duplus = error - (double)uplus_local;
    uVar2 = ref_phys_spalding_dyplus_duplus(y,(REF_DBL *)&iters);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x298,
             "ref_phys_spalding_uplus",(ulong)uVar2,"dyplus");
      return uVar2;
    }
    y = y - dyplus_duplus / _iters;
    if (error * 1e+20 <= 0.0) {
      local_58 = -(error * 1e+20);
    }
    else {
      local_58 = error * 1e+20;
    }
    if (dyplus_duplus <= 0.0) {
      local_68 = -dyplus_duplus;
    }
    else {
      local_68 = dyplus_duplus;
    }
    if (local_58 <= local_68) {
LAB_00235987:
      if (dyplus_duplus <= 0.0) {
        local_80 = -dyplus_duplus;
      }
      else {
        local_80 = dyplus_duplus;
      }
      bVar1 = 1e-15 < local_80;
    }
    else {
      if (error <= 0.0) {
        local_70 = -error;
      }
      else {
        local_70 = error;
      }
      if (local_70 <= 0.001) goto LAB_00235987;
      if (dyplus_duplus / error <= 0.0) {
        local_78 = -(dyplus_duplus / error);
      }
      else {
        local_78 = dyplus_duplus / error;
      }
      bVar1 = 1e-12 < local_78;
    }
    ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1;
    if (99 < ref_private_macro_code_rss_1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x2a4,
             "ref_phys_spalding_uplus","iteration count exceeded");
      printf(" y %e u %e err %e dydu %e\n",error,y,dyplus_duplus,_iters);
      return 1;
    }
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_phys_spalding_uplus(REF_DBL yplus, REF_DBL *uplus) {
  REF_DBL u, y, error, dyplus_duplus;
  REF_BOOL keep_going;
  REF_INT iters;
  u = yplus;
  if (u > 12) u = log(yplus / 0.1108) / 0.4;

  iters = 0;
  keep_going = REF_TRUE;
  while (keep_going) {
    RSS(ref_phys_spalding_yplus(u, &y), "yplus");
    error = y - yplus;

    RSS(ref_phys_spalding_dyplus_duplus(u, &dyplus_duplus), "dyplus");

    u = u - error / dyplus_duplus;

    if (ref_math_divisible(error, y) && ABS(y) > 1.0e-3) {
      keep_going = (ABS(error / y) > 1.0e-12);
    } else {
      keep_going = (ABS(error) > 1.0e-15);
    }

    iters++;
    RAB(iters < 100, "iteration count exceeded",
        { printf(" y %e u %e err %e dydu %e\n", y, u, error, dyplus_duplus); });
  }

  *uplus = u;

  return REF_SUCCESS;
}